

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O1

void Llb_MtrUseSelectedColumn(Llb_Mtr_t *p,int iCol)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if ((iCol < 1) || (p->nCols + -1 <= iCol)) {
    __assert_fail("iCol >= 1 && iCol < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                  ,0xa0,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
  }
  if (0 < p->nRows) {
    lVar3 = 0;
    do {
      if (p->pMatrix[(uint)iCol][lVar3] != '\0') {
        pcVar2 = p->pProdVars;
        if (pcVar2[lVar3] == '\0') {
          pcVar2[lVar3] = '\x01';
          p->pProdNums[lVar3] = p->pRowSums[lVar3];
        }
        else if ((pcVar2[lVar3] == '\x01') && (p->pProdNums[lVar3] == 1)) {
          pcVar2[lVar3] = '\0';
          p->pProdNums[lVar3] = 0;
          goto LAB_0081dfb4;
        }
        iVar1 = p->pProdNums[lVar3];
        p->pProdNums[lVar3] = iVar1 + -1;
        if (iVar1 < 1) {
          __assert_fail("p->pProdNums[iVar] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                        ,0xb1,"void Llb_MtrUseSelectedColumn(Llb_Mtr_t *, int)");
        }
      }
LAB_0081dfb4:
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nRows);
  }
  return;
}

Assistant:

void Llb_MtrUseSelectedColumn( Llb_Mtr_t * p, int iCol )
{
    int iVar;
    assert( iCol >= 1 && iCol < p->nCols - 1 );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iCol][iVar] == 0 )
            continue;
        if ( p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1 )
        {
            p->pProdVars[iVar] = 0;
            p->pProdNums[iVar] = 0;
            continue;
        }
        if ( p->pProdVars[iVar] == 0 )
        {
            p->pProdVars[iVar] = 1;
            p->pProdNums[iVar] = p->pRowSums[iVar];
        }
        p->pProdNums[iVar]--;
        assert( p->pProdNums[iVar] >= 0 );
        if ( p->pProdNums[iVar] < 0 )
            Abc_Print( -1, "Llb_MtrUseSelectedColumn() Internal error!\n" );
    }
}